

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::primary_expr(analysis *this)

{
  bool bVar1;
  TYPE TVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  analysis *in_RSI;
  NodePtr NVar6;
  allocator local_229;
  string local_228 [32];
  undefined1 local_208 [24];
  string local_1f0 [36];
  int local_1cc;
  undefined1 local_1c8 [8];
  NodePtr tmp_ptr_1;
  allocator local_189;
  string local_188 [32];
  undefined1 local_168 [8];
  NodePtr tmp_ptr;
  string local_150 [32];
  token local_130;
  shared_ptr<dh::TreeNode> local_108;
  undefined1 local_f8 [8];
  string tmp_str;
  int local_d4;
  token local_d0;
  int local_a8 [2];
  undefined1 local_a0 [32];
  shared_ptr<dh::TreeNode> local_80;
  int local_6c [3];
  shared_ptr<dh::TreeNode> local_60;
  float local_50;
  int local_4c;
  float tmp_float;
  int local_44;
  shared_ptr<dh::TreeNode> local_40;
  int local_30 [2];
  int tmp_int;
  int local_20;
  undefined1 local_19;
  int lineno;
  analysis *this_local;
  NodePtr *ret;
  
  local_19 = 0;
  this_local = this;
  std::shared_ptr<dh::TreeNode>::shared_ptr((shared_ptr<dh::TreeNode> *)this);
  peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  local_20 = token::getLineno(peVar3);
  peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  TVar2 = token::getType(peVar3);
  if (TVar2 == NUMINT) {
    local_30[0] = numberInteger(in_RSI);
    std::make_shared<dh::TreeNode,int&,int&>((int *)&local_40,local_30);
    std::shared_ptr<dh::TreeNode>::operator=((shared_ptr<dh::TreeNode> *)this,&local_40);
    std::shared_ptr<dh::TreeNode>::~shared_ptr(&local_40);
    peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    local_44 = 1;
    TreeNode::setNodeKind(peVar4,&local_44);
    peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    tmp_float = 1.54143e-44;
    TreeNode::setKind(peVar4,(int *)&tmp_float);
    peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    local_4c = 2;
    TreeNode::setType(peVar4,&local_4c);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->tmp);
    TVar2 = token::getType(peVar3);
    if (TVar2 == NUMFLOAT) {
      local_50 = numberFloat(in_RSI);
      std::make_shared<dh::TreeNode,float&,int&>((float *)&local_60,(int *)&local_50);
      std::shared_ptr<dh::TreeNode>::operator=((shared_ptr<dh::TreeNode> *)this,&local_60);
      std::shared_ptr<dh::TreeNode>::~shared_ptr(&local_60);
      peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_6c[2] = 1;
      TreeNode::setNodeKind(peVar4,local_6c + 2);
      peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_6c[1] = 0xc;
      TreeNode::setKind(peVar4,local_6c + 1);
      peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_6c[0] = 3;
      TreeNode::setType(peVar4,local_6c);
      _Var5._M_pi = extraout_RDX_00;
    }
    else {
      peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      TVar2 = token::getType(peVar3);
      if (TVar2 != NUMBOOLEAN) {
        peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&in_RSI->tmp);
        TVar2 = token::getType(peVar3);
        if (TVar2 != STRING) {
          peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&in_RSI->tmp);
          TVar2 = token::getType(peVar3);
          if (TVar2 == ID) {
            identifier_abi_cxx11_((analysis *)local_f8);
            std::make_shared<dh::TreeNode,std::__cxx11::string&,int&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_108,(int *)local_f8);
            std::shared_ptr<dh::TreeNode>::operator=((shared_ptr<dh::TreeNode> *)this,&local_108);
            std::shared_ptr<dh::TreeNode>::~shared_ptr(&local_108);
            peVar4 = std::
                     __shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
            local_130._lineno = 1;
            TreeNode::setNodeKind(peVar4,&local_130._lineno);
            std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &in_RSI->tmp);
            token::getVal_abi_cxx11_(&local_130);
            bVar1 = std::operator==(&local_130._val,"[");
            std::__cxx11::string::~string((string *)&local_130);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_150,"[",
                         (allocator *)
                         ((long)&tmp_ptr.
                                 super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              match(in_RSI,(string *)local_150);
              std::__cxx11::string::~string(local_150);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&tmp_ptr.
                                 super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              peVar4 = std::
                       __shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
              tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._0_4_ = 8;
              TreeNode::setKind(peVar4,(int *)&tmp_ptr.
                                               super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount);
              expr((analysis *)local_168);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_188,"]",&local_189);
              match(in_RSI,(string *)local_188);
              std::__cxx11::string::~string(local_188);
              std::allocator<char>::~allocator((allocator<char> *)&local_189);
              peVar4 = std::
                       __shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
              TreeNode::appendChild(peVar4,(NodePtr *)local_168);
              std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_168);
            }
            else {
              std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )&in_RSI->tmp);
              token::getVal_abi_cxx11_((token *)&stack0xfffffffffffffe50);
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&stack0xfffffffffffffe50,"(");
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
              if (bVar1) {
                peVar4 = std::
                         __shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this);
                tmp_ptr_1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_ = 9;
                TreeNode::setKind(peVar4,(int *)((long)&tmp_ptr_1.
                                                                                                                
                                                  super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 4));
                arg_list((analysis *)local_1c8);
                peVar4 = std::
                         __shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this);
                TreeNode::appendChild(peVar4,(NodePtr *)local_1c8);
                std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_1c8);
              }
              else {
                peVar4 = std::
                         __shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this);
                local_1cc = 0xf;
                TreeNode::setKind(peVar4,&local_1cc);
              }
            }
            std::__cxx11::string::~string((string *)local_f8);
            _Var5._M_pi = extraout_RDX_02;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1f0,"(",(allocator *)(local_208 + 0x17));
            match(in_RSI,(string *)local_1f0);
            std::__cxx11::string::~string(local_1f0);
            std::allocator<char>::~allocator((allocator<char> *)(local_208 + 0x17));
            expr((analysis *)local_208);
            std::shared_ptr<dh::TreeNode>::operator=
                      ((shared_ptr<dh::TreeNode> *)this,(shared_ptr<dh::TreeNode> *)local_208);
            std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_208);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_228,")",&local_229);
            match(in_RSI,(string *)local_228);
            std::__cxx11::string::~string(local_228);
            std::allocator<char>::~allocator((allocator<char> *)&local_229);
            _Var5._M_pi = extraout_RDX_03;
          }
          goto LAB_0013c3ca;
        }
      }
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      token::getVal_abi_cxx11_((token *)local_a0);
      std::make_shared<dh::TreeNode,std::__cxx11::string,int&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                 (int *)local_a0);
      std::shared_ptr<dh::TreeNode>::operator=((shared_ptr<dh::TreeNode> *)this,&local_80);
      std::shared_ptr<dh::TreeNode>::~shared_ptr(&local_80);
      std::__cxx11::string::~string((string *)local_a0);
      peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      TVar2 = token::getType(peVar3);
      if (TVar2 == NUMBOOLEAN) {
        peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        local_a8[1] = 0;
        TreeNode::setType(peVar4,local_a8 + 1);
        peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        local_a8[0] = 0xd;
        TreeNode::setKind(peVar4,local_a8);
      }
      else {
        peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        local_d0._lineno = 1;
        TreeNode::setType(peVar4,&local_d0._lineno);
        peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        local_d0._type = ELSE;
        TreeNode::setKind(peVar4,(int *)&local_d0._type);
      }
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      token::getVal_abi_cxx11_(&local_d0);
      match(in_RSI,&local_d0._val);
      std::__cxx11::string::~string((string *)&local_d0);
      peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_d4 = 1;
      TreeNode::setNodeKind(peVar4,&local_d4);
      _Var5._M_pi = extraout_RDX_01;
    }
  }
LAB_0013c3ca:
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi
  ;
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::primary_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in primary_expr\n";
#endif
	NodePtr ret;

	int lineno = tmp->getLineno();
	if ( tmp->getType() == TYPE::NUMINT)
	{
		int tmp_int = numberInteger();
		ret = ::std::make_shared<TreeNode>(tmp_int,lineno);
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::INTLITERAL);
		ret->setType(TypeKind::IntK);
	} else if ( tmp->getType() == TYPE::NUMFLOAT)
	{
		float tmp_float = numberFloat();
		ret = ::std::make_shared<TreeNode>(tmp_float,lineno);
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::FLOATLITERAL);
		ret->setType(TypeKind::FloatK);
	} else if ( tmp->getType() == TYPE::NUMBOOLEAN || tmp->getType() == TYPE::STRING)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),lineno);

		if ( tmp->getType() == TYPE::NUMBOOLEAN){
			ret->setType(TypeKind::BoolK);
			ret->setKind(ExprKind::BOOLLITERAL);
		} else 
		{
			ret->setType(TypeKind::StringK);
			ret->setKind(ExprKind::STRINGLITERAL);
		}
		match(tmp->getVal());
		ret->setNodeKind(NodeKind::ExprK);
	} else if ( tmp->getType() == TYPE::ID)
	{
		::std::string tmp_str = identifier();

		ret = ::std::make_shared<TreeNode>(tmp_str,lineno);
		ret->setNodeKind(NodeKind::ExprK);

		if ( tmp->getVal() == "[")
		{
			match("[");
			ret->setKind(ExprKind::ArrayExp);
			NodePtr tmp_ptr = expr();
			match("]");
			ret->appendChild(tmp_ptr);
		} else if ( tmp->getVal() == "(")
		{
			ret->setKind(ExprKind::FuncExp);
			NodePtr tmp_ptr = arg_list();
			ret->appendChild(tmp_ptr);
		} else 
		{
			ret->setKind(ExprKind::IdK);
		}
	} else 
	{
		match("(");
		ret = expr();
		match(")");
	}

	return ret;
}